

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,NodeRef *args,uint *args_1)

{
  NodeRef in_RDX;
  undefined8 *in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                        (in_stack_00000030,(pointer)this,args,args_1);
  }
  else {
    end(in_RDI);
    IntervalMapDetails::Path::Entry::Entry
              ((Entry *)*in_RSI,in_RDX,(uint32_t)((ulong)in_RDI >> 0x20));
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }